

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_0::HasZero(Constant *c)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  undefined8 *puVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Constant **comp;
  undefined8 *puVar6;
  bool bVar7;
  undefined4 extraout_var_00;
  
  iVar3 = (*c->_vptr_Constant[0x16])();
  bVar7 = true;
  if (CONCAT44(extraout_var,iVar3) == 0) {
    iVar3 = (*c->_vptr_Constant[0x13])(c);
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
    if (plVar4 == (long *)0x0) {
      iVar3 = (*c->_vptr_Constant[0xd])(c);
      if (CONCAT44(extraout_var_01,iVar3) != 0) {
        iVar3 = (*c->_vptr_Constant[0xd])(c);
        uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0xb8))
                          ((long *)CONCAT44(extraout_var_02,iVar3));
        return (bool)uVar2;
      }
      __assert_fail("c->AsScalarConstant()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x21a,
                    "bool spvtools::opt::(anonymous namespace)::HasZero(const analysis::Constant *)"
                   );
    }
    puVar5 = (undefined8 *)(**(code **)(*plVar4 + 0xc0))(plVar4);
    puVar6 = (undefined8 *)*puVar5;
    puVar5 = (undefined8 *)puVar5[1];
    do {
      bVar7 = puVar6 != puVar5;
      if (puVar6 == puVar5) {
        return bVar7;
      }
      bVar1 = HasZero((Constant *)*puVar6);
      puVar6 = puVar6 + 1;
    } while (!bVar1);
  }
  return bVar7;
}

Assistant:

bool HasZero(const analysis::Constant* c) {
  if (c->AsNullConstant()) {
    return true;
  }
  if (const analysis::VectorConstant* vec_const = c->AsVectorConstant()) {
    for (auto& comp : vec_const->GetComponents())
      if (HasZero(comp)) return true;
  } else {
    assert(c->AsScalarConstant());
    return c->AsScalarConstant()->IsZero();
  }

  return false;
}